

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

void __thiscall Tigre::String::String(String *this,char *s)

{
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  strlen(s);
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,(ulong)s);
  return;
}

Assistant:

Tigre::String::String(const char s[]){
    this->value = s;
}